

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processError(CoreBroker *this,ActionMessage *command)

{
  BrokerBase *this_00;
  GlobalBrokerId brokerid;
  action_t aVar1;
  int iVar2;
  int iVar3;
  BaseTimeCoordinator *pBVar4;
  string_view message;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var5;
  _func_int *UNRECOVERED_JUMPTABLE;
  string_view estring;
  string_view estring_00;
  string_view estring_01;
  
  this_00 = &this->super_BrokerBase;
  do {
    message._M_str = (char *)(command->payload).heap;
    message._M_len = (command->payload).bufferSize;
    BrokerBase::sendToLogger
              (this_00,(GlobalFederateId)(command->source_id).gid,0,(string_view)ZEXT816(0),message,
               false);
    brokerid.gid = (command->source_id).gid;
    if (brokerid.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
      BrokerBase::setBrokerState(this_00,ERRORED);
      if (command->messageAction == cmd_global_error) {
        estring._M_str = (char *)(command->payload).heap;
        estring._M_len = (command->payload).bufferSize;
        BrokerBase::setErrorState(this_00,command->messageID,estring);
      }
      broadcast(this,command);
      if ((this->super_BrokerBase).field_0x294 != '\0') {
        return;
      }
      ActionMessage::setAction(command,cmd_local_error);
      UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x23];
LAB_0027f841:
      (*UNRECOVERED_JUMPTABLE)(this,0,command);
      return;
    }
    if ((uint)brokerid.gid < 2) {
      BrokerBase::setBrokerState(this_00,ERRORED);
      if (command->messageAction == cmd_global_error) {
        estring_00._M_str = (char *)(command->payload).heap;
        estring_00._M_len = (command->payload).bufferSize;
        BrokerBase::setErrorState(this_00,command->messageID,estring_00);
      }
LAB_0027f8d0:
      broadcast(this,command);
      return;
    }
    _Var5._M_current = (BasicFedInfo *)getBrokerById(this,brokerid);
    if (((BasicBrokerInfo *)_Var5._M_current != (BasicBrokerInfo *)0x0) ||
       (_Var5 = gmlc::containers::
                DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                ::find(&this->mFederates,&command->source_id),
       _Var5._M_current !=
       (this->mFederates).dataStorage.
       super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      ((BasicBrokerInfo *)_Var5._M_current)->state = ERROR_STATE;
    }
    aVar1 = command->messageAction;
    if ((aVar1 != cmd_error) && (aVar1 != cmd_local_error)) {
      if (aVar1 != cmd_global_error) {
        return;
      }
      estring_01._M_str = (char *)(command->payload).heap;
      estring_01._M_len = (command->payload).bufferSize;
      BrokerBase::setErrorState(this_00,command->messageID,estring_01);
      iVar3 = (this->super_BrokerBase).global_broker_id_local.gid;
      if (((this->super_BrokerBase).field_0x294 != '\0') ||
         (iVar2 = (command->dest_id).gid, iVar2 == 0 || iVar2 == iVar3)) {
        (command->source_id).gid = iVar3;
        goto LAB_0027f8d0;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x22];
      goto LAB_0027f841;
    }
    if ((this->super_BrokerBase).terminate_on_error != true) {
      if (((this->super_BrokerBase).field_0x294 == '\0') &&
         (iVar3 = (command->dest_id).gid,
         iVar3 != 0 && iVar3 != (this->super_BrokerBase).global_broker_id_local.gid)) {
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
      }
      if ((this->super_BrokerBase).hasTimeDependency != true) {
        return;
      }
      pBVar4 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar4->_vptr_BaseTimeCoordinator[3])(pBVar4,command);
      return;
    }
    ActionMessage::setAction(command,cmd_global_error);
  } while( true );
}

Assistant:

void CoreBroker::processError(ActionMessage& command)
{
    sendToLogger(command.source_id,
                 LogLevels::ERROR_LEVEL,
                 std::string_view(),
                 command.payload.to_string());
    if (command.source_id == global_broker_id_local) {
        setBrokerState(BrokerState::ERRORED);
        if (command.action() == CMD_GLOBAL_ERROR) {
            setErrorState(command.messageID, command.payload.to_string());
        }
        broadcast(command);
        if (!isRootc) {
            command.setAction(CMD_LOCAL_ERROR);
            transmit(parent_route_id, std::move(command));
        }
        return;
    }

    if (command.source_id == parent_broker_id || command.source_id == gRootBrokerID) {
        setBrokerState(BrokerState::ERRORED);
        if (command.action() == CMD_GLOBAL_ERROR) {
            setErrorState(command.messageID, command.payload.to_string());
        }
        broadcast(command);
        return;
    }

    auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
    if (brk == nullptr) {
        auto fed = mFederates.find(command.source_id);
        if (fed != mFederates.end()) {
            fed->state = ConnectionState::ERROR_STATE;
        }
    } else {
        brk->state = ConnectionState::ERROR_STATE;
    }

    switch (command.action()) {
        case CMD_LOCAL_ERROR:
        case CMD_ERROR:
            if (terminate_on_error) {
                // upgrade the error to a global error and reprocess
                command.setAction(CMD_GLOBAL_ERROR);
                processError(command);
                return;
            }
            if (!(isRootc || command.dest_id == global_broker_id_local ||
                  command.dest_id == parent_broker_id)) {
                transmit(parent_route_id, command);
            }
            if (hasTimeDependency) {
                timeCoord->processTimeMessage(command);
            }
            break;
        case CMD_GLOBAL_ERROR:
            setErrorState(command.messageID, command.payload.to_string());
            if (!(isRootc || command.dest_id == global_broker_id_local ||
                  command.dest_id == parent_broker_id)) {
                transmit(parent_route_id, command);
            } else {
                command.source_id = global_broker_id_local;
                broadcast(command);
            }
            break;
        default:
            break;
    }
}